

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::~DrawTestInstanceBase(DrawTestInstanceBase *this)

{
  DrawTestInstanceBase *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR___cxa_pure_virtual_0166aca0;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&this->m_cmdPool);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&this->m_vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_colorTargetView);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr(&this->m_colorTargetImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&this->m_pipeline);
  DrawParamsBase::~DrawParamsBase(&this->m_data);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

DrawTestInstanceBase::~DrawTestInstanceBase (void)
{
}